

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

string * __thiscall
cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_
          (string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  char *pcVar1;
  ostream *poVar2;
  undefined1 local_1c8 [8];
  ostringstream e;
  allocator local_39;
  string local_38 [8];
  string pid;
  PolicyID id_local;
  
  pid.field_2._12_4_ = SUB84(this,0);
  pcVar1 = idToString(pid.field_2._12_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  poVar2 = std::operator<<((ostream *)local_1c8,"Policy ");
  poVar2 = std::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2," may not be set to OLD behavior because this ");
  poVar2 = std::operator<<(poVar2,"version of CMake no longer supports it.  ");
  poVar2 = std::operator<<(poVar2,"The policy was introduced in ");
  poVar2 = std::operator<<(poVar2,"CMake version ");
  pcVar1 = idToVersion(pid.field_2._12_4_);
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,", and use of NEW behavior is now required.");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Please either update your CMakeLists.txt files to conform to ");
  poVar2 = std::operator<<(poVar2,"the new behavior or use an older version of CMake that still ");
  poVar2 = std::operator<<(poVar2,"supports the old behavior.  ");
  poVar2 = std::operator<<(poVar2,"Run cmake --help-policy ");
  poVar2 = std::operator<<(poVar2,local_38);
  std::operator<<(poVar2," for more information.");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmPolicies::GetRequiredAlwaysPolicyError(cmPolicies::PolicyID id)
{
  std::string pid = idToString(id);
  std::ostringstream e;
  e << "Policy " << pid << " may not be set to OLD behavior because this "
    << "version of CMake no longer supports it.  "
    << "The policy was introduced in "
    << "CMake version " << idToVersion(id)
    << ", and use of NEW behavior is now required."
    << "\n"
    << "Please either update your CMakeLists.txt files to conform to "
    << "the new behavior or use an older version of CMake that still "
    << "supports the old behavior.  "
    << "Run cmake --help-policy " << pid << " for more information.";
  return e.str();
}